

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

bool __thiscall
sptk::Matrix::GetSubmatrix
          (Matrix *this,int row_offset,int num_row_of_submatrix,int column_offset,
          int num_column_of_submatrix,Matrix *submatrix)

{
  double dVar1;
  const_reference ppdVar2;
  reference ppdVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int j;
  int i;
  int local_30;
  int local_2c;
  bool local_1;
  
  if (((((in_ESI < 0) || (in_EDX < 1)) || (*(int *)(in_RDI + 8) < in_ESI + in_EDX)) ||
      ((in_ECX < 0 || (in_R8D < 1)))) ||
     ((*(int *)(in_RDI + 0xc) < in_ECX + in_R8D || ((in_R9 == 0 || (in_RDI == in_R9)))))) {
    local_1 = false;
  }
  else {
    if ((*(int *)(in_R9 + 8) != in_EDX) || (*(int *)(in_R9 + 0xc) != in_R8D)) {
      Resize((Matrix *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_R9 >> 0x20),(int)in_R9);
    }
    for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
        ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),
                             (long)(in_ESI + local_2c));
        dVar1 = (*ppdVar2)[in_ECX + local_30];
        ppdVar3 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            ((vector<double_*,_std::allocator<double_*>_> *)(in_R9 + 0x28),
                             (long)local_2c);
        (*ppdVar3)[local_30] = dVar1;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Matrix::GetSubmatrix(int row_offset, int num_row_of_submatrix,
                          int column_offset, int num_column_of_submatrix,
                          Matrix* submatrix) const {
  if (row_offset < 0 || num_row_of_submatrix <= 0 ||
      num_row_ < row_offset + num_row_of_submatrix || column_offset < 0 ||
      num_column_of_submatrix <= 0 ||
      num_column_ < column_offset + num_column_of_submatrix ||
      NULL == submatrix || this == submatrix) {
    return false;
  }

  if (submatrix->num_row_ != num_row_of_submatrix ||
      submatrix->num_column_ != num_column_of_submatrix) {
    submatrix->Resize(num_row_of_submatrix, num_column_of_submatrix);
  }

  for (int i(0); i < num_row_of_submatrix; ++i) {
    for (int j(0); j < num_column_of_submatrix; ++j) {
      submatrix->index_[i][j] = index_[row_offset + i][column_offset + j];
    }
  }

  return true;
}